

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall kj::anon_unknown_8::DiskHandle::exists(DiskHandle *this,PathPtr path)

{
  int iVar1;
  bool bVar2;
  char *__file;
  Fault f;
  Array<char> local_58;
  PathPtr local_40;
  
  local_40.parts.size_ = path.parts.size_;
  local_40.parts.ptr = path.parts.ptr;
  while( true ) {
    iVar1 = (this->fd).fd;
    PathPtr::toString((String *)&local_58,&local_40,false);
    __file = "";
    if (local_58.size_ != 0) {
      __file = local_58.ptr;
    }
    iVar1 = faccessat(iVar1,__file,0,0);
    Array<char>::~Array(&local_58);
    bVar2 = true;
    if (-1 < iVar1) break;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
    if (iVar1 != -1) {
      if (iVar1 != 0) {
        if ((iVar1 != 2) && (iVar1 != 0x14)) {
          kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                    ((Fault *)&local_58,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x2d0,iVar1,"faccessat(fd, path)","path",&local_40);
          kj::_::Debug::Fault::~Fault((Fault *)&local_58);
        }
        bVar2 = false;
      }
      return bVar2;
    }
  }
  return true;
}

Assistant:

bool exists(PathPtr path) const {
    KJ_SYSCALL_HANDLE_ERRORS(faccessat(fd, path.toString().cStr(), F_OK, 0)) {
      case ENOENT:
      case ENOTDIR:
        return false;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return false; }
    }
    return true;
  }